

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar1;
  pointer puVar2;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var3;
  Option *pOVar4;
  string *__rhs;
  OptionAlreadyAdded *pOVar5;
  undefined7 in_register_00000081;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar6;
  allocator local_36d;
  undefined4 local_36c;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_368;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_360;
  string local_340;
  string local_320;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Option myopt;
  
  local_36c = (undefined4)CONCAT71(in_register_00000081,defaulted);
  ::std::__cxx11::string::string((string *)&local_2c0,(string *)option_name);
  ::std::__cxx11::string::string((string *)&local_2e0,(string *)option_description);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&local_300,option_callback);
  Option::Option(&myopt,&local_2c0,&local_2e0,&local_300,this);
  std::_Function_base::~_Function_base(&local_300.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_2e0);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  _Var3 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&myopt);
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current == puVar1) {
    local_368 = func;
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::emplace_back<>(&this->options_);
    puVar2 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pOVar4 = (Option *)operator_new(0x230);
    ::std::__cxx11::string::string((string *)&local_320,(string *)option_name);
    ::std::__cxx11::string::string((string *)&local_340,(string *)option_description);
    std::
    function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function(&local_360,option_callback);
    Option::Option(pOVar4,&local_320,&local_340,&local_360,this);
    this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar2 + -1);
    std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar4);
    std::_Function_base::~_Function_base(&local_360.super__Function_base);
    ::std::__cxx11::string::~string((string *)&local_340);
    ::std::__cxx11::string::~string((string *)&local_320);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,
              local_368);
    if ((char)local_36c != '\0') {
      Option::capture_default_str
                ((this_00->_M_t).
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    }
    OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
              (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
               (this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    pOVar4 = (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((char)local_36c == '\0') &&
       ((pOVar4->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
      Option::capture_default_str(pOVar4);
      pOVar4 = (this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    }
    Option::~Option(&myopt);
    return pOVar4;
  }
  puVar6 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar6 == puVar1) {
      pOVar5 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string
                ((string *)&local_2a0,"added option matched existing option name",&local_36d);
      OptionAlreadyAdded::OptionAlreadyAdded(pOVar5,&local_2a0);
      __cxa_throw(pOVar5,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
    __rhs = Option::matching_name_abi_cxx11_
                      ((puVar6->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&myopt);
    puVar6 = puVar6 + 1;
  } while (__rhs->_M_string_length == 0);
  pOVar5 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  ::std::operator+(&local_280,"added option matched existing option name: ",__rhs);
  OptionAlreadyAdded::OptionAlreadyAdded(pOVar5,&local_280);
  __cxa_throw(pOVar5,&OptionAlreadyAdded::typeinfo,Error::~Error);
}

Assistant:

Option *add_option(std::string option_name,
                       callback_t option_callback,
                       std::string option_description = "",
                       bool defaulted = false,
                       std::function<std::string()> func = {}) {
        Option myopt{option_name, option_description, option_callback, this};

        if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) {
               return *v == myopt;
           }) == std::end(options_)) {
            options_.emplace_back();
            Option_p &option = options_.back();
            option.reset(new Option(option_name, option_description, option_callback, this));

            // Set the default string capture function
            option->default_function(func);

            // For compatibility with CLI11 1.7 and before, capture the default string here
            if(defaulted)
                option->capture_default_str();

            // Transfer defaults to the new option
            option_defaults_.copy_to(option.get());

            // Don't bother to capture if we already did
            if(!defaulted && option->get_always_capture_default())
                option->capture_default_str();

            return option.get();
        }
        // we know something matches now find what it is so we can produce more error information
        for(auto &opt : options_) {
            auto &matchname = opt->matching_name(myopt);
            if(!matchname.empty()) {
                throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
            }
        }
        // this line should not be reached the above loop should trigger the throw
        throw(OptionAlreadyAdded("added option matched existing option name")); // LCOV_EXCL_LINE
    }